

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

DeferDeserializeFunctionInfo *
Js::DeferDeserializeFunctionInfo::New
          (ScriptContext *scriptContext,int nestedCount,LocalFunctionId functionId,
          ByteCodeCache *byteCodeCache,byte *serializedFunction,Utf8SourceInfo *sourceInfo,
          char16 *displayName,uint displayNameLength,uint displayShortNameOffset,
          NativeModule *nativeModule,Attributes attributes)

{
  Recycler *alloc;
  DeferDeserializeFunctionInfo *this;
  uint functionNumber;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  local_68 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab02c8;
  data.filename._0_4_ = 0x654;
  data._32_8_ = sourceInfo;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
  this = (DeferDeserializeFunctionInfo *)new<Memory::Recycler>(0x70,alloc,0x39e810);
  functionNumber = scriptContext->threadContext->functionCount + 1;
  scriptContext->threadContext->functionCount = functionNumber;
  DeferDeserializeFunctionInfo
            (this,nestedCount,functionId,byteCodeCache,serializedFunction,
             (Utf8SourceInfo *)data._32_8_,scriptContext,functionNumber,displayName,
             displayNameLength,displayShortNameOffset,nativeModule,attributes);
  return this;
}

Assistant:

DeferDeserializeFunctionInfo* DeferDeserializeFunctionInfo::New(ScriptContext* scriptContext, int nestedCount, LocalFunctionId functionId, ByteCodeCache* byteCodeCache, const byte* serializedFunction, Utf8SourceInfo* sourceInfo, const char16* displayName, uint displayNameLength, uint displayShortNameOffset, NativeModule *nativeModule, FunctionInfo::Attributes attributes)
    {
        return RecyclerNewFinalized(scriptContext->GetRecycler(),
            DeferDeserializeFunctionInfo,
            nestedCount,
            functionId,
            byteCodeCache,
            serializedFunction,
            sourceInfo,
            scriptContext,
            scriptContext->GetThreadContext()->NewFunctionNumber(),
            displayName,
            displayNameLength,
            displayShortNameOffset,
            nativeModule,
            attributes);
    }